

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O1

void __thiscall EefcFlash::writePage(EefcFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  uint uVar2;
  undefined8 *puVar3;
  bool bVar4;
  
  if (page < (this->super_Flash)._pages) {
    this_00 = &(this->super_Flash)._wordCopy;
    WordCopyApplet::setDstAddr(this_00,(this->super_Flash)._size * page + (this->super_Flash)._addr)
    ;
    WordCopyApplet::setSrcAddr
              (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
    pbVar1 = &(this->super_Flash)._onBufferA;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    waitFSR(this,1);
    Applet::runv(&this_00->super_Applet);
    uVar2 = 4;
    if ((this->super_Flash)._planes == 2) {
      uVar2 = (this->super_Flash)._pages >> 1;
      bVar4 = uVar2 <= page;
      if (bVar4) {
        page = page - uVar2;
      }
      uVar2 = (uint)bVar4 << 9 | 4;
    }
    Samba::writeWord((this->super_Flash)._samba,uVar2 + *(int *)&(this->super_Flash).field_0xf4,
                     page * 0x100 + (uint)this->_eraseAuto * 2 | 0x5a000001);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001197a0;
  __cxa_throw(puVar3,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
EefcFlash::writePage(uint32_t page)
{
    if (page >= _pages)
        throw FlashPageError();

    _wordCopy.setDstAddr(_addr + page * _size);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitFSR();
    _wordCopy.runv();
    if (_planes == 2 && page >= _pages / 2)
        writeFCR1(_eraseAuto ? EEFC_FCMD_EWP : EEFC_FCMD_WP, page - _pages / 2);
    else
        writeFCR0(_eraseAuto ? EEFC_FCMD_EWP : EEFC_FCMD_WP, page);
}